

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O0

bool isValidHttpHeaderValueField(QAnyStringView value)

{
  byte bVar1;
  bool bVar2;
  long in_FS_OFFSET;
  bool valid;
  QLoggingCategoryMacroHolder<(QtMsgType)1> qt_category;
  undefined6 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffae;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  char *in_stack_ffffffffffffffb8;
  QMessageLogger *in_stack_ffffffffffffffc0;
  undefined8 local_18;
  anon_class_1_0_00000001 *in_stack_fffffffffffffff0;
  QAnyStringView *this;
  
  this = *(QAnyStringView **)(in_FS_OFFSET + 0x28);
  bVar1 = QAnyStringView::visit<isValidHttpHeaderValueField(QAnyStringView)::__0>
                    (this,in_stack_fffffffffffffff0);
  if (!(bool)bVar1) {
    local_18 = 0xaaaaaaaaaaaaaaaa;
    lcQHttpHeaders();
    anon_unknown.dwarf_1a98d9::QLoggingCategoryMacroHolder<(QtMsgType)1>::
    QLoggingCategoryMacroHolder
              ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)
               CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
               (QLoggingCategory *)
               CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8)));
    while (bVar2 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                             ((QLoggingCategoryMacroHolder *)&local_18), bVar2) {
      anon_unknown.dwarf_1a98d9::QLoggingCategoryMacroHolder<(QtMsgType)1>::name
                ((QLoggingCategoryMacroHolder<(QtMsgType)1> *)0x1c6bec);
      QMessageLogger::QMessageLogger
                (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                 (char *)CONCAT17(bVar1,CONCAT16(in_stack_ffffffffffffffae,in_stack_ffffffffffffffa8
                                                )),(char *)0x1c6c02);
      QMessageLogger::warning
                (&stack0xffffffffffffffb0,"HTTP header value contained illegal character(s)");
    }
  }
  if (*(QAnyStringView **)(in_FS_OFFSET + 0x28) != this) {
    __stack_chk_fail();
  }
  return (bool)(bVar1 & 1);
}

Assistant:

static bool isValidHttpHeaderValueField(QAnyStringView value) noexcept
{
    const bool valid = value.visit([](auto value){ return headerValueValidImpl(value); });
    if (!valid)
        qCWarning(lcQHttpHeaders, "HTTP header value contained illegal character(s)");
    return valid;
}